

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  mtree *mtree;
  bool bVar2;
  __mode_t p;
  uint uVar3;
  int iVar4;
  uint uVar5;
  mode_t mVar6;
  int *piVar7;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar8;
  archive_string *paVar9;
  ulong uVar10;
  size_t sVar11;
  mtree_entry *pmVar12;
  mtree_entry *pmVar13;
  mtree_entry **ppmVar14;
  size_t len;
  long lVar15;
  la_int64_t lVar16;
  char *pcVar17;
  size_t sVar18;
  char cVar19;
  long lVar20;
  mtree_option **global_00;
  char *pcVar21;
  byte *pbVar22;
  long lVar23;
  mtree_entry *__s_00;
  undefined1 *puVar24;
  mtree_entry *pmVar25;
  mtree_entry *pmVar26;
  char *pcVar27;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat st_storage;
  archive_entry *local_108;
  uint local_fc;
  mtree_entry *local_f8;
  mtree_entry *local_f0;
  archive_string *local_e8;
  mtree_entry **local_e0;
  archive_entry *local_d8;
  archive_entry *local_d0;
  mtree_entry *local_c8;
  stat local_c0;
  
  mtree = (mtree *)a->format->data;
  if (-1 < mtree->fd) {
    close(mtree->fd);
    mtree->fd = -1;
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      pcVar21 = (char *)0xffffffe2;
      goto LAB_00574cac;
    }
    local_d8 = entry;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = 0x80000;
    mtree->archive_format_name = "mtree";
    local_108 = (archive_entry *)0x0;
    detect_form(a,(int *)&local_d0);
    local_e8 = (archive_string *)0x1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s != (void *)0x0) {
      local_c8 = (mtree_entry *)&mtree->entries;
      local_e0 = mtree->entry_hashtable;
      local_f0 = (mtree_entry *)0x0;
LAB_005744b1:
      lVar23 = 0;
      pcVar17 = (char *)0x0;
      do {
        pmVar26 = (mtree_entry *)local_c0.st_dev;
        if ((long)local_c0.st_dev < 0) goto LAB_00574c76;
        pvVar8 = memchr(__s,10,local_c0.st_dev);
        if (pvVar8 != (void *)0x0) {
          pmVar26 = (mtree_entry *)((long)pvVar8 + (1 - (long)__s));
          local_c0.st_dev = (__dev_t)pmVar26;
        }
        if (0xffff < (long)(pcVar17 + (long)&pmVar26->next)) {
          pcVar21 = "Line too long";
          iVar4 = 0x54;
          goto LAB_00574c6f;
        }
        paVar9 = archive_string_ensure
                           ((archive_string *)mtree,(size_t)(pcVar17 + (long)&pmVar26->next + 1));
        if (paVar9 == (archive_string *)0x0) {
          pcVar21 = "Can\'t allocate working buffer";
          iVar4 = 0xc;
          goto LAB_00574c6f;
        }
        memcpy((mtree->line).s + (long)pcVar17,__s,local_c0.st_dev);
        __archive_read_consume(a,local_c0.st_dev);
        iVar4 = (int)local_d0;
        pcVar21 = pcVar17 + (long)(mtree_entry **)local_c0.st_dev;
        (mtree->line).s[(long)pcVar21] = '\0';
        pmVar26 = (mtree_entry *)(mtree->line).s;
        pbVar22 = (byte *)((long)&pmVar26->next + lVar23);
LAB_0057454c:
        bVar1 = *pbVar22;
        if (bVar1 < 0x5c) {
          if (bVar1 == 0x23) {
            if (pvVar8 == (void *)0x0) goto LAB_0057458a;
          }
          else {
            if (bVar1 == 0) goto LAB_0057458a;
            if (bVar1 == 10) {
              if (pcVar21 == (char *)0x0) break;
              if (-1 < (long)pcVar21) {
                lVar23 = 0;
                pmVar25 = pmVar26;
                goto LAB_005745e5;
              }
              free_options((mtree_option *)local_108);
              entry = local_d8;
              if ((int)pcVar21 != 0) goto LAB_00574cac;
              goto LAB_00574046;
            }
          }
LAB_00574582:
          pbVar22 = pbVar22 + 1;
          goto LAB_0057454c;
        }
        if ((bVar1 != 0x5c) || (pbVar22[1] == 0)) goto LAB_00574582;
        if (pbVar22[1] != 10) {
          pbVar22 = pbVar22 + 1;
          goto LAB_00574582;
        }
        ((undefined1 *)((long)&pmVar26[-1].hashtable_next + 6))[(long)pcVar21] = 0;
        pcVar21 = pcVar21 + -2;
        pmVar26 = (mtree_entry *)(mtree->line).s;
LAB_0057458a:
        lVar23 = (long)pbVar22 - (long)pmVar26;
        __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
        pcVar17 = pcVar21;
      } while (__s != (void *)0x0);
    }
LAB_00574aba:
    mtree->this_entry = mtree->entries;
    free_options((mtree_option *)local_108);
    entry = local_d8;
  }
LAB_00574046:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  pmVar26 = mtree->this_entry;
  if (pmVar26 != (mtree_entry *)0x0) {
    paVar9 = &mtree->current_dir;
    local_e8 = paVar9;
    do {
      pcVar21 = pmVar26->name;
      if (((*pcVar21 == '.') && (pcVar21[1] == '.')) && (pcVar21[2] == '\0')) {
        pmVar26->used = '\x01';
        sVar18 = (mtree->current_dir).length;
        if (sVar18 != 0) {
          pcVar21 = paVar9->s;
          pcVar17 = pcVar21 + sVar18;
          do {
            pcVar27 = pcVar17;
            pcVar17 = pcVar27 + -1;
            if (pcVar17 < pcVar21) break;
          } while (*pcVar17 != '/');
          pcVar27 = pcVar27 + -2;
          if (pcVar17 < pcVar21) {
            pcVar27 = pcVar17;
          }
          (mtree->current_dir).length = (size_t)(pcVar27 + (1 - (long)pcVar21));
        }
      }
      else if (pmVar26->used == '\0') {
        pmVar26->used = '\x01';
        local_108 = entry;
        archive_entry_set_filetype(entry,0x8000);
        archive_entry_set_size(entry,0);
        (mtree->contents_name).length = 0;
        local_fc = 0;
        uVar3 = parse_line(a,entry,mtree,pmVar26,(int *)&local_fc);
        if (pmVar26->full == '\0') {
          sVar18 = (mtree->current_dir).length;
          if (sVar18 != 0) {
            archive_strcat(paVar9,"/");
          }
          archive_strcat(paVar9,pmVar26->name);
          archive_entry_copy_pathname(entry,paVar9->s);
          mVar6 = archive_entry_filetype(entry);
          if (mVar6 != 0x4000) {
            (mtree->current_dir).length = sVar18;
          }
        }
        else {
          archive_entry_copy_pathname(entry,pmVar26->name);
          for (pmVar25 = pmVar26->hashtable_next; pmVar25 != (mtree_entry *)0x0;
              pmVar25 = pmVar25->hashtable_next) {
            if (((pmVar25->full != '\0') && (pmVar25->used == '\0')) &&
               ((pmVar26->name_hash == pmVar25->name_hash &&
                (iVar4 = strcmp(pmVar26->name,pmVar25->name), iVar4 == 0)))) {
              pmVar25->used = '\x01';
              uVar5 = parse_line(a,entry,mtree,pmVar25,(int *)&local_fc);
              if ((int)uVar5 < (int)uVar3) {
                uVar3 = uVar5;
              }
            }
          }
        }
        if (mtree->checkfs == '\0') {
LAB_00574bfc:
          lVar16 = archive_entry_size(entry);
          mtree->cur_size = lVar16;
          mtree->offset = 0;
        }
        else {
          mtree->fd = -1;
          if ((mtree->contents_name).length == 0) {
            pcVar21 = archive_entry_pathname(entry);
          }
          else {
            pcVar21 = (mtree->contents_name).s;
          }
          mVar6 = archive_entry_filetype(entry);
          paVar9 = local_e8;
          if ((mVar6 == 0x8000) || (mVar6 = archive_entry_filetype(entry), mVar6 == 0x4000)) {
            iVar4 = open(pcVar21,0x80000);
            mtree->fd = iVar4;
            __archive_ensure_cloexec_flag(iVar4);
            iVar4 = mtree->fd;
            if (iVar4 == -1) {
              piVar7 = __errno_location();
              if ((*piVar7 != 2) || ((mtree->contents_name).length != 0)) {
                archive_set_error(&a->archive,*piVar7,"Can\'t open %s",pcVar21);
                uVar3 = 0xffffffec;
              }
              goto LAB_00574248;
            }
          }
          else {
LAB_00574248:
            iVar4 = mtree->fd;
          }
          if (iVar4 < 0) {
            iVar4 = lstat(pcVar21,&local_c0);
            if (iVar4 != -1) goto LAB_005742a4;
LAB_005742dd:
            if ((local_fc & 0x800) == 0) goto LAB_00574bfc;
LAB_005743fa:
            pmVar26 = mtree->this_entry;
            goto LAB_005743fe;
          }
          iVar4 = fstat(iVar4,&local_c0);
          if (iVar4 == -1) {
            piVar7 = __errno_location();
            archive_set_error(&a->archive,*piVar7,"Could not fstat %s",pcVar21);
            close(mtree->fd);
            mtree->fd = -1;
            uVar3 = 0xffffffec;
            goto LAB_005742dd;
          }
LAB_005742a4:
          p = local_c0.st_mode;
          uVar5 = local_c0.st_mode & 0xf000;
          if (uVar5 == 0xa000) {
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 != 0xa000) goto LAB_0057434d;
LAB_00574ad6:
            uVar5 = local_fc;
            if (((local_fc & 0x1001) != 1) &&
               ((mVar6 = archive_entry_filetype(entry), mVar6 == 0x2000 ||
                (mVar6 = archive_entry_filetype(entry), mVar6 == 0x6000)))) {
              archive_entry_set_rdev(entry,local_c0.st_rdev);
            }
            if ((uVar5 & 0xc) == 0 || (uVar5 >> 0xc & 1) != 0) {
              archive_entry_set_gid(entry,(ulong)local_c0.st_gid);
            }
            if ((uVar5 & 0x600) == 0 || (uVar5 >> 0xc & 1) != 0) {
              archive_entry_set_uid(entry,(ulong)local_c0.st_uid);
            }
            if ((uVar5 & 0x1010) != 0x10) {
              archive_entry_set_mtime(entry,local_c0.st_mtim.tv_sec,local_c0.st_mtim.tv_nsec);
            }
            if ((uVar5 & 0x1020) != 0x20) {
              archive_entry_set_nlink(entry,(uint)local_c0.st_nlink);
            }
            if ((uVar5 & 0x1040) != 0x40) {
              archive_entry_set_perm(entry,p);
            }
            if ((uVar5 & 0x1080) != 0x80) {
              archive_entry_set_size(entry,local_c0.st_size);
            }
            archive_entry_set_ino(entry,local_c0.st_ino);
            archive_entry_set_dev(entry,local_c0.st_dev);
            archive_entry_linkify(mtree->resolver,&local_108,&local_d0);
            entry = local_108;
            goto LAB_00574bfc;
          }
          if ((uVar5 == 0x8000) && (mVar6 = archive_entry_filetype(entry), mVar6 == 0x8000))
          goto LAB_00574ad6;
LAB_0057434d:
          if (((~p & 0xc000) == 0) && (mVar6 = archive_entry_filetype(entry), mVar6 == 0xc000))
          goto LAB_00574ad6;
          switch(uVar5 - 0x1000 >> 0xc) {
          case 0:
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 == 0x1000) goto LAB_00574ad6;
            break;
          case 1:
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 == 0x2000) goto LAB_00574ad6;
            break;
          case 3:
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 == 0x4000) goto LAB_00574ad6;
            break;
          case 5:
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 == 0x6000) goto LAB_00574ad6;
          }
          if (-1 < mtree->fd) {
            close(mtree->fd);
          }
          mtree->fd = -1;
          if ((local_fc & 0x800) != 0) goto LAB_005743fa;
          if (uVar3 == 0) {
            pcVar21 = archive_entry_pathname(entry);
            archive_set_error(&a->archive,-1,"mtree specification has different type for %s",pcVar21
                             );
            uVar3 = 0xffffffec;
          }
        }
        pcVar21 = (char *)(ulong)uVar3;
        goto LAB_00574cac;
      }
LAB_005743fe:
      pmVar26 = pmVar26->next;
      mtree->this_entry = pmVar26;
    } while (pmVar26 != (mtree_entry *)0x0);
  }
  pcVar21 = (char *)0x1;
LAB_00574cac:
  return (int)pcVar21;
LAB_005745e5:
  pmVar25 = (mtree_entry *)((long)&pmVar25->next + 1);
  uVar10 = (ulong)*(byte *)((long)&pmVar26->next + lVar23);
  if (0x2f < uVar10) goto LAB_00574778;
  if ((0x100000200U >> (uVar10 & 0x3f) & 1) == 0) {
    if ((0x800002401U >> (uVar10 & 0x3f) & 1) != 0) goto LAB_00574612;
    if (uVar10 == 0x2f) {
      pcVar21 = (char *)((long)(mtree_entry **)local_c0.st_dev + ((long)pcVar17 - lVar23));
      if (4 < (long)pcVar21) {
        pcVar17 = (char *)((long)&pmVar26->next + lVar23);
        iVar4 = strncmp(pcVar17,"/set",4);
        if (iVar4 == 0) {
          cVar19 = *(char *)((long)&pmVar26->next + lVar23 + 4);
          if ((cVar19 == ' ') || (cVar19 == '\t')) {
            pcVar21 = (char *)((long)&pmVar26->next + lVar23 + 4);
            goto LAB_00574857;
          }
        }
        else if ((((char *)0x6 < pcVar21) && (iVar4 = strncmp(pcVar17,"/unset",6), iVar4 == 0)) &&
                ((cVar19 = *(char *)((long)&pmVar26->next + lVar23 + 6), cVar19 == ' ' ||
                 (cVar19 == '\t')))) {
          pcVar17 = (char *)((long)&pmVar26->next + lVar23 + 6);
          pcVar21 = strchr(pcVar17,0x3d);
          if (pcVar21 != (char *)0x0) {
            pcVar21 = "/unset shall not contain `=\'";
            iVar4 = -1;
            goto LAB_00574c6f;
          }
          sVar11 = strspn(pcVar17," \t\r\n");
          cVar19 = *(char *)((long)&pmVar26->next + lVar23 + 6 + sVar11);
          if (cVar19 == '\0') goto LAB_00574612;
          pcVar21 = (char *)((long)&pmVar26->next + lVar23 + sVar11 + 6);
          goto LAB_005746fb;
        }
      }
      archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_e8);
      goto LAB_00574c76;
    }
    goto LAB_00574778;
  }
  lVar23 = lVar23 + 1;
  goto LAB_005745e5;
LAB_00574857:
  sVar11 = strspn(pcVar21," \t\r\n");
  if (pcVar21[sVar11] == '\0') goto LAB_00574612;
  pcVar27 = pcVar21 + sVar11;
  sVar11 = strcspn(pcVar27," \t\r\n");
  pcVar21 = pcVar27 + sVar11;
  pcVar17 = strchr(pcVar27,0x3d);
  sVar18 = (long)pcVar17 - (long)pcVar27;
  if (pcVar21 < pcVar17) {
    sVar18 = sVar11;
  }
  remove_option((mtree_option **)&local_108,pcVar27,sVar18);
  uVar3 = add_option(a,(mtree_option **)&local_108,pcVar27,sVar11);
  if (uVar3 != 0) {
    pcVar21 = (char *)(ulong)uVar3;
    goto LAB_00574ca2;
  }
  goto LAB_00574857;
LAB_005746fb:
  do {
    sVar11 = strcspn(pcVar21," \t\r\n");
    sVar18 = sVar11;
    if (sVar11 == 3) {
      if (((cVar19 != 'a') || (pcVar21[1] != 'l')) || (pcVar21[2] != 'l')) {
        sVar18 = 3;
        goto LAB_00574754;
      }
      free_options((mtree_option *)local_108);
      local_108 = (archive_entry *)0x0;
    }
    else {
LAB_00574754:
      remove_option((mtree_option **)&local_108,pcVar21,sVar18);
    }
    pcVar21 = pcVar21 + sVar11;
    sVar11 = strspn(pcVar21," \t\r\n");
    cVar19 = pcVar21[sVar11];
    pcVar21 = pcVar21 + sVar11;
  } while (cVar19 != '\0');
  goto LAB_00574612;
LAB_00574778:
  local_f8 = (mtree_entry *)local_c0.st_dev;
  pmVar12 = (mtree_entry *)malloc(0x28);
  if (pmVar12 != (mtree_entry *)0x0) {
    __s_00 = (mtree_entry *)((long)&pmVar26->next + lVar23);
    lVar20 = (long)(pcVar17 + (long)&local_f8->next) - lVar23;
    pmVar12->name_hash = 0;
    pmVar12->hashtable_next = (mtree_entry *)0x0;
    pmVar12->next = (mtree_entry *)0x0;
    pmVar12->options = (mtree_option *)0x0;
    *(undefined8 *)((long)&pmVar12->options + 2) = 0;
    *(undefined8 *)((long)&pmVar12->name + 2) = 0;
    pmVar13 = local_f0;
    if (local_f0 == (mtree_entry *)0x0) {
      pmVar13 = local_c8;
    }
    pmVar13->next = pmVar12;
    if (iVar4 != 0) {
      local_f0 = __s_00;
      if (0 < lVar20) {
        pbVar22 = (byte *)(pcVar17 + (long)&local_f8->next + (long)&pmVar26->next);
LAB_005747f0:
        pbVar22 = pbVar22 + -1;
        if (((ulong)*pbVar22 < 0x21) && ((0x100002600U >> ((ulong)*pbVar22 & 0x3f) & 1) != 0))
        goto code_r0x00574811;
        lVar15 = 0;
        do {
          uVar10 = (ulong)*(byte *)((long)&pmVar25[-1].hashtable_next + 7);
          if ((uVar10 < 0x21) && ((0x100002600U >> (uVar10 & 0x3f) & 1) != 0)) {
            local_f0 = pmVar25;
          }
          lVar15 = lVar15 + 1;
          pmVar25 = (mtree_entry *)((long)&pmVar25->next + 1);
        } while (lVar20 != lVar15);
      }
      goto LAB_00574826;
    }
    local_f8 = pmVar12;
    pcVar21 = (char *)strcspn((char *)__s_00," \t\r\n");
    pmVar26 = (mtree_entry *)(pcVar21 + (long)(lVar23 + (long)&pmVar26->next));
    local_f0 = (mtree_entry *)(lVar20 + (long)pmVar26);
    goto LAB_005748f8;
  }
  goto LAB_00574ce0;
code_r0x00574811:
  bVar2 = lVar20 < 2;
  lVar20 = lVar20 + -1;
  if (bVar2) goto code_r0x00574821;
  goto LAB_005747f0;
code_r0x00574821:
  lVar20 = 0;
LAB_00574826:
  pcVar21 = (char *)((long)pmVar26 + lVar23 + (lVar20 - (long)local_f0));
  pmVar26 = __s_00;
  __s_00 = local_f0;
  local_f8 = pmVar12;
LAB_005748f8:
  pcVar17 = (char *)malloc((size_t)(pcVar21 + 1));
  local_f8->name = pcVar17;
  if (pcVar17 != (char *)0x0) {
    memcpy(pcVar17,__s_00,(size_t)pcVar21);
    pcVar17[(long)pcVar21] = '\0';
    parse_escapes(pcVar17,local_f8);
    pcVar21 = local_f8->name;
    cVar19 = *pcVar21;
    if (cVar19 == '\0') {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      do {
        pcVar21 = pcVar21 + 1;
        uVar3 = uVar3 * 0x10 + (int)cVar19;
        if ((uVar3 & 0xf0000000) != 0) {
          uVar3 = uVar3 & 0xfffffff ^ (uVar3 & 0xf0000000) >> 0x18;
        }
        cVar19 = *pcVar21;
      } while (cVar19 != '\0');
    }
    local_f8->name_hash = uVar3;
    pmVar25 = local_e0[uVar3 & 0x3ff];
    if (local_e0[uVar3 & 0x3ff] == (mtree_entry *)0x0) {
      ppmVar14 = local_e0 + (uVar3 & 0x3ff);
    }
    else {
      do {
        pmVar12 = pmVar25;
        pmVar25 = pmVar12->hashtable_next;
      } while (pmVar25 != (mtree_entry *)0x0);
      ppmVar14 = &pmVar12->hashtable_next;
    }
    global_00 = &local_f8->options;
    *ppmVar14 = local_f8;
    puVar24 = (undefined1 *)&local_108;
    while (puVar24 = *(undefined1 **)puVar24, puVar24 != (undefined1 *)0x0) {
      pcVar21 = *(char **)((long)puVar24 + 8);
      sVar11 = strlen(pcVar21);
      uVar3 = add_option(a,global_00,pcVar21,sVar11);
      if (uVar3 != 0) goto LAB_00574c7e;
    }
    while ((sVar11 = strspn((char *)pmVar26," \t\r\n"),
           *(char *)((long)&pmVar26->next + sVar11) != '\0' &&
           (pmVar25 = (mtree_entry *)((long)&pmVar26->next + sVar11), pmVar25 < local_f0))) {
      len = strcspn((char *)pmVar25," \t\r\n");
      pmVar26 = (mtree_entry *)((long)&pmVar25->next + len);
      pmVar12 = (mtree_entry *)strchr((char *)pmVar25,0x3d);
      sVar11 = (long)pmVar12 - (long)pmVar25;
      if (pmVar26 < pmVar12) {
        sVar11 = len;
      }
      if (pmVar12 == (mtree_entry *)0x0) {
        sVar11 = len;
      }
      remove_option(global_00,(char *)pmVar25,sVar11);
      uVar3 = add_option(a,global_00,(char *)pmVar25,len);
      if (uVar3 != 0) goto LAB_00574c7e;
    }
    local_f0 = local_f8;
LAB_00574612:
    local_e8 = (archive_string *)((long)local_e8 + 1);
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s == (void *)0x0) goto LAB_00574aba;
    goto LAB_005744b1;
  }
LAB_00574ce0:
  piVar7 = __errno_location();
  iVar4 = *piVar7;
  pcVar21 = "Can\'t allocate memory";
LAB_00574c6f:
  archive_set_error(&a->archive,iVar4,pcVar21);
LAB_00574c76:
  pcVar21 = (char *)0xffffffe2;
LAB_00574ca2:
  free_options((mtree_option *)local_108);
  goto LAB_00574cac;
LAB_00574c7e:
  pcVar21 = (char *)(ulong)uVar3;
  goto LAB_00574ca2;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  unsigned long crc32_val;
  int ret = (ARCHIVE_OK), ret2;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_val = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_val = crc32(crc32_val, h, (unsigned)(header_size - 7));
  if ((crc32_val & 0xffff) != archive_le16dec(rar_header.crc)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    char *newptr;
    size_t newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length = *(p + offset++);

            if (length & 0x80) {
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      filename[filename_size++] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    filename_size == rar->filename_save_size &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      rar->nodes++;
      if ((rar->dbo =
        realloc(rar->dbo, sizeof(*rar->dbo) * rar->nodes)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }

  rar->filename_save = (char*)realloc(rar->filename_save,
                                      filename_size + 1);
  memcpy(rar->filename_save, rar->filename, filename_size + 1);
  rar->filename_save_size = filename_size;

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
  rar->ppmd_valid = rar->ppmd_eod = 0;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}